

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall
DReachabilityPropagator::explain_dominator(DReachabilityPropagator *this,int u,int dom,vec<Lit> *ps)

{
  byte bVar1;
  uint uVar2;
  BoolView *pBVar3;
  int skip_n;
  allocator_type local_86;
  allocator_type local_85;
  int local_84;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_84 = dom;
  vec<Lit>::push(ps);
  uVar2 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ =
       (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2;
  vec<Lit>::push(ps,(Lit *)&local_80);
  pBVar3 = (this->super_GraphPropagator).vs.data;
  uVar2 = pBVar3[(uint)u].v;
  bVar1 = sat.assigns.data[uVar2];
  if ((bVar1 != 0) && ((uint)pBVar3[(uint)u].s * -2 + 1 == (int)(char)bVar1)) {
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = (uint)(bVar1 < 0xfe) + uVar2 * 2;
    vec<Lit>::push(ps,(Lit *)&local_80);
  }
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_58,&local_86);
  skip_n = local_84;
  reverseDFS(this,u,&local_80,local_84);
  local_86 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_86,&local_85);
  reverseDFStoBorder(this,u,&local_58,&local_80,ps,skip_n);
  if ((void *)CONCAT71(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._1_7_,local_58.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p._0_1_));
  }
  if ((void *)CONCAT44(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                       (int)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_80.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p));
  }
  return;
}

Assistant:

void DReachabilityPropagator::explain_dominator(int u, int dom, vec<Lit>& ps) {
	if (DEBUG) {
		std::cout << "Explain dominators " << getNodeVar(get_root_idx()).isFixed()
							<< getNodeVar(u).isFixed() << '\n';
	}
	ps.push();
	ps.push(getNodeVar(get_root_idx()).getValLit());
	if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
		ps.push(getNodeVar(u).getValLit());
	}
	std::vector<bool> red(nbNodes(), false);
	reverseDFS(u, red, dom);
	std::vector<bool> v(nbNodes(), false);
	reverseDFStoBorder(u, v, red, ps, dom);
	if (DEBUG) {
		std::cout << "Size expl for dominator " << ps.size() << '\n';
	}
}